

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

string * __thiscall pbrt::ParameterDictionary::GetTexture(ParameterDictionary *this,string *name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_t sVar2;
  const_reference pvVar3;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_00;
  allocator<char> local_39;
  ParsedParameter *local_38;
  
  this_00 = in_RDI;
  __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::begin(in_RSI);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
         ::end(this_00);
  while( true ) {
    if (__s == args) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                 (char *)__s,(allocator<char> *)args);
      std::allocator<char>::~allocator(&local_39);
      return (string *)in_RDI;
    }
    local_38 = *(ParsedParameter **)__s;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00,in_stack_ffffffffffffff98);
    if ((!bVar1) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this_00,(char *)in_stack_ffffffffffffff98), !bVar1)) break;
    __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &__s->_M_string_length;
  }
  bVar1 = pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x4318e6);
  if (!bVar1) {
    sVar2 = pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_38->strings);
    if (sVar2 < 2) {
      local_38->lookedUp = true;
      pvVar3 = pstd::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38->strings,0);
      std::__cxx11::string::string((string *)this_00,(string *)pvVar3);
      return (string *)in_RDI;
    }
    ErrorExit<std::__cxx11::string_const&>((FileLoc *)in_RSI,(char *)__s,args);
  }
  ErrorExit<std::__cxx11::string_const&>((FileLoc *)in_RSI,(char *)__s,args);
}

Assistant:

std::string ParameterDictionary::GetTexture(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != "texture")
            continue;

        if (p->strings.empty())
            ErrorExit(&p->loc, "No string values provided for parameter \"%s\".", name);
        if (p->strings.size() > 1)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);
        p->lookedUp = true;
        return p->strings[0];
    }

    return "";
}